

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void av1_inv_txfm2d_add_8x8_sse4_1
               (int32_t *input,uint16_t *output,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  int8_t *piVar2;
  undefined7 in_register_00000009;
  int fliplr;
  int flipud;
  int in_R9D;
  __m128i out [16];
  __m128i in [16];
  
  piVar2 = av1_inv_txfm_shift_ls[1];
  switch(CONCAT71(in_register_00000009,tx_type) & 0xffffffff) {
  case 0:
    load_buffer_8x8(input,in);
    idct8x8_sse4_1(in,out,0,bd,-(int)*piVar2,in_R9D);
    break;
  case 1:
    load_buffer_8x8(input,in);
    idct8x8_sse4_1(in,out,0,bd,-(int)*piVar2,in_R9D);
    goto LAB_0037d8ea;
  case 2:
    load_buffer_8x8(input,in);
    iadst8x8_sse4_1(in,out,0,bd,-(int)*piVar2,in_R9D);
    break;
  case 3:
    load_buffer_8x8(input,in);
    iadst8x8_sse4_1(in,out,0,bd,-(int)*piVar2,in_R9D);
LAB_0037d8ea:
    transpose_8x8(out,in);
    iadst8x8_sse4_1(in,out,1,bd,0,in_R9D);
    goto LAB_0037d908;
  case 4:
    load_buffer_8x8(input,in);
    idct8x8_sse4_1(in,out,0,bd,-(int)*piVar2,in_R9D);
    goto LAB_0037da1b;
  case 5:
    load_buffer_8x8(input,in);
    iadst8x8_sse4_1(in,out,0,bd,-(int)*piVar2,in_R9D);
    transpose_8x8(out,in);
    idct8x8_sse4_1(in,out,1,bd,0,in_R9D);
    goto LAB_0037d96c;
  case 6:
    load_buffer_8x8(input,in);
    iadst8x8_sse4_1(in,out,0,bd,-(int)*piVar2,in_R9D);
    transpose_8x8(out,in);
    fliplr = 1;
    iadst8x8_sse4_1(in,out,1,bd,0,in_R9D);
    cVar1 = piVar2[1];
    goto LAB_0037da52;
  case 7:
    load_buffer_8x8(input,in);
    iadst8x8_sse4_1(in,out,0,bd,-(int)*piVar2,in_R9D);
    transpose_8x8(out,in);
    iadst8x8_sse4_1(in,out,1,bd,0,in_R9D);
LAB_0037d96c:
    fliplr = 1;
    cVar1 = piVar2[1];
    goto LAB_0037d983;
  case 8:
    load_buffer_8x8(input,in);
    iadst8x8_sse4_1(in,out,0,bd,-(int)*piVar2,in_R9D);
LAB_0037da1b:
    transpose_8x8(out,in);
    iadst8x8_sse4_1(in,out,1,bd,0,in_R9D);
    cVar1 = piVar2[1];
    fliplr = 0;
LAB_0037da52:
    flipud = 1;
    goto LAB_0037da55;
  default:
    goto switchD_0037d794_default;
  }
  transpose_8x8(out,in);
  idct8x8_sse4_1(in,out,1,bd,0,in_R9D);
LAB_0037d908:
  cVar1 = piVar2[1];
  fliplr = 0;
LAB_0037d983:
  flipud = 0;
LAB_0037da55:
  write_buffer_8x8(out,output,stride,fliplr,flipud,-(int)cVar1,bd);
switchD_0037d794_default:
  return;
}

Assistant:

void av1_inv_txfm2d_add_8x8_sse4_1(const int32_t *input, uint16_t *output,
                                   int stride, TX_TYPE tx_type, int bd) {
  __m128i in[16], out[16];
  const int8_t *shift = av1_inv_txfm_shift_ls[TX_8X8];

  switch (tx_type) {
    case DCT_DCT:
      load_buffer_8x8(input, in);
      idct8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      idct8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 0, 0, -shift[1], bd);
      break;
    case DCT_ADST:
      load_buffer_8x8(input, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      idct8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 0, 0, -shift[1], bd);
      break;
    case ADST_DCT:
      load_buffer_8x8(input, in);
      idct8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 0, 0, -shift[1], bd);
      break;
    case ADST_ADST:
      load_buffer_8x8(input, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 0, 0, -shift[1], bd);
      break;
    case FLIPADST_DCT:
      load_buffer_8x8(input, in);
      idct8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 0, 1, -shift[1], bd);
      break;
    case DCT_FLIPADST:
      load_buffer_8x8(input, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      idct8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 1, 0, -shift[1], bd);
      break;
    case ADST_FLIPADST:
      load_buffer_8x8(input, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 1, 0, -shift[1], bd);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_8x8(input, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 1, 1, -shift[1], bd);
      break;
    case FLIPADST_ADST:
      load_buffer_8x8(input, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 0, 1, -shift[1], bd);
      break;
    default: assert(0);
  }
}